

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependVarConstant
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,Var var)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int32 value;
  uint32 uVar4;
  uint32 uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *this_00;
  JavascriptBoolean *pJVar8;
  char16_t *clue;
  double value_00;
  byte bStack_40;
  
  if ((undefined8 *)var == &NullFrameDisplay) {
    clue = L"Null Frame Display";
    bStack_40 = '\t';
    goto LAB_007c28d9;
  }
  if ((undefined8 *)var == &StrictNullFrameDisplay) {
    clue = L"Strict Null Frame Display";
    bStack_40 = '\n';
    goto LAB_007c28d9;
  }
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_007c2b8d;
    *puVar7 = 0;
  }
  bVar3 = TaggedInt::Is(var);
  if (bVar3) {
switchD_007c2a58_caseD_3:
    value = TaggedInt::ToInt32(var);
    if ((char)(byte)value == value) {
      uVar4 = PrependByte(this,builder,L"Integer Constant",'\x01');
      uVar5 = PrependByte(this,builder,L"Integer Constant Value",(byte)value);
    }
    else if ((short)value == value) {
      uVar4 = PrependByte(this,builder,L"Integer Constant",'\x02');
      uVar5 = PrependConstantInt16
                        (this,builder,L"Integer Constant Value",(short)value,
                         (ConstantSizedBufferBuilderOf<short> **)0x0);
    }
    else {
      uVar4 = PrependByte(this,builder,L"Integer Constant",'\x03');
      uVar5 = PrependConstantInt32
                        (this,builder,L"Integer Constant Value",value,
                         (ConstantSizedBufferBuilderOf<int> **)0x0);
    }
    goto LAB_007c2b16;
  }
  if ((ulong)var >> 0x32 == 0) {
    this_00 = UnsafeVarTo<Js::RecyclableObject>(var);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_007c2b8d;
      *puVar7 = 0;
    }
    TVar1 = ((this_00->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar6 = RecyclableObject::IsExternal(this_00), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_007c2b8d;
      *puVar7 = 0;
    }
    switch(TVar1) {
    case TypeIds_Undefined:
      clue = L"Undefined Constant";
      bStack_40 = '\b';
      break;
    case TypeIds_Null:
      clue = L"Null Constant";
      bStack_40 = '\a';
      break;
    case TypeIds_Boolean:
      pJVar8 = VarTo<Js::JavascriptBoolean>(var);
      bStack_40 = (pJVar8->value == 0) + '\v';
      clue = L"Boolean Constant";
      break;
    case TypeIds_FirstNumberType:
      goto switchD_007c2a58_caseD_3;
    case TypeIds_Number:
      goto switchD_007c2a58_caseD_4;
    case TypeIds_String:
      bVar3 = VarIs<Js::PropertyString>(var);
      uVar4 = PrependByte(this,builder,L"String Constant 16",bVar3 + '\x05');
      uVar5 = PrependStringConstant(this,builder,var);
      goto LAB_007c2b16;
    default:
      if (TVar1 == TypeIds_ArrayLastWithES5) {
        uVar4 = PrependByte(this,builder,L"String Template Callsite Constant",'\r');
        uVar5 = PrependStringTemplateCallsiteConstant(this,builder,var);
        goto LAB_007c2b16;
      }
    case TypeIds_Int64Number:
    case TypeIds_LastNumberType:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x62e,"((0))","Unexpected object type in AddConstantTable");
      if (bVar3) {
        *puVar7 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
LAB_007c2b8d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
LAB_007c28d9:
    uVar4 = PrependByte(this,builder,clue,bStack_40);
    return uVar4;
  }
switchD_007c2a58_caseD_4:
  uVar4 = PrependByte(this,builder,L"Number Constant",'\x04');
  value_00 = JavascriptNumber::GetValue(var);
  uVar5 = PrependDouble(this,builder,L"Number Constant Value",value_00);
LAB_007c2b16:
  return uVar5 + uVar4;
}

Assistant:

uint32 PrependVarConstant(BufferBuilderList & builder, Var var)
    {
        if (var == (Js::Var)&Js::NullFrameDisplay)
        {
            return PrependByte(builder, _u("Null Frame Display"), ctNullDisplay);
        }
        else if (var == (Js::Var)&Js::StrictNullFrameDisplay)
        {
            return PrependByte(builder, _u("Strict Null Frame Display"), ctStrictNullDisplay);
        }

        auto typeId = JavascriptOperators::GetTypeId(var);
        switch (typeId)
        {
        case TypeIds_Undefined:
            return PrependByte(builder, _u("Undefined Constant"), ctUndefined);

        case TypeIds_Null:
            return PrependByte(builder, _u("Null Constant"), ctNull);

        case TypeIds_Boolean:
            return PrependByte(builder, _u("Boolean Constant"), VarTo<JavascriptBoolean>(var)->GetValue()? ctTrue : ctFalse);

        case TypeIds_Number:
        {
            auto size = PrependByte(builder, _u("Number Constant"), ctNumber);
            return size + PrependDouble(builder,  _u("Number Constant Value"), JavascriptNumber::GetValue(var));
        }

        case TypeIds_Integer:
        {
            int32 value = TaggedInt::ToInt32(var);
            if ((int8)value == value)
            {
                auto size = PrependByte(builder, _u("Integer Constant"), ctInt8);
                return size + PrependByte(builder, _u("Integer Constant Value"), (byte)value);
            }
            else if ((int16)value == value)
            {
                auto size = PrependByte(builder, _u("Integer Constant"), ctInt16);
                return size + PrependConstantInt16(builder, _u("Integer Constant Value"), (int16)value);
            }
            else
            {
                auto size = PrependByte(builder, _u("Integer Constant"), ctInt32);
                return size + PrependConstantInt32(builder, _u("Integer Constant Value"), value);
            }
        }

        case TypeIds_String:
        {
            auto size = PrependByte(builder, _u("String Constant 16"),
                Js::VarIs<Js::PropertyString>(var)? ctPropertyString16 : ctString16);
            return size + PrependStringConstant(builder, var);
        }

        case TypeIds_ES5Array:
        {
            // ES5Array objects in the constant table are always string template callsite objects.
            // If we later put other ES5Array objects in the constant table, we'll need another way
            // to decide the constant type.
            auto size = PrependByte(builder, _u("String Template Callsite Constant"), ctStringTemplateCallsite);
            return size + PrependStringTemplateCallsiteConstant(builder, var);
        }

        default:
            AssertMsg(UNREACHED, "Unexpected object type in AddConstantTable");
            Throw::FatalInternalError();
        }
    }